

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

Node * NewDocTypeNode(TidyDocImpl *doc)

{
  Node *element;
  Node *html;
  Node *doctype;
  TidyDocImpl *doc_local;
  
  element = prvTidyFindHTML(doc);
  if (element == (Node *)0x0) {
    doc_local = (TidyDocImpl *)0x0;
  }
  else {
    doc_local = (TidyDocImpl *)prvTidyNewNode(doc->allocator,(Lexer *)0x0);
    (doc_local->root).type = DocTypeTag;
    prvTidyInsertNodeBeforeElement(element,(Node *)doc_local);
  }
  return &doc_local->root;
}

Assistant:

static Node* NewDocTypeNode( TidyDocImpl* doc )
{
    Node* doctype = NULL;
    Node* html = TY_(FindHTML)( doc );

    if ( !html )
        return NULL;

    doctype = TY_(NewNode)( doc->allocator, NULL );
    doctype->type = DocTypeTag;
    TY_(InsertNodeBeforeElement)(html, doctype);
    return doctype;
}